

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<datarate_test::(anonymous_namespace)::DatarateTestRealtime_BasicRateTargetingSuperresCBRMultiThreads_Test>
::CreateTest(ParameterizedTestFactory<datarate_test::(anonymous_namespace)::DatarateTestRealtime_BasicRateTargetingSuperresCBRMultiThreads_Test>
             *this)

{
  Test *this_00;
  
  WithParamInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,int,unsigned_int,int>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x4d0);
  datarate_test::anon_unknown_0::DatarateTestRealtime::DatarateTestRealtime
            ((DatarateTestRealtime *)this_00);
  (((DatarateTestLarge *)&this_00->_vptr_Test)->
  super_CodecTestWith4Params<libaom_test::TestMode,_int,_unsigned_int,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__DatarateTestLarge_00f1eb68;
  this_00[1]._vptr_Test =
       (_func_int **)
       &PTR__DatarateTestRealtime_BasicRateTargetingSuperresCBRMultiThreads_Test_00f1ec10;
  this_00[1].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)
       &PTR__DatarateTestRealtime_BasicRateTargetingSuperresCBRMultiThreads_Test_00f1ec30;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }